

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

void __thiscall ncnn::LSTM::LSTM(LSTM *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__LSTM_005a0380;
  (this->weight_xc_data_int8_scales).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->weight_hc_data).data = (void *)0x0;
  (this->weight_hc_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_hc_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_hc_data).elemsize + 4) = 0;
  (this->weight_hc_data).allocator = (Allocator *)0x0;
  (this->weight_hc_data).dims = 0;
  (this->weight_hc_data).w = 0;
  (this->weight_hc_data).w = 0;
  (this->weight_hc_data).h = 0;
  (this->weight_hc_data).d = 0;
  (this->weight_hc_data).c = 0;
  (this->weight_xc_data).elempack = 0;
  (this->weight_hc_data).cstep = 0;
  (this->weight_xc_data).data = (void *)0x0;
  (this->weight_xc_data).refcount = (int *)0x0;
  (this->weight_xc_data).elemsize = 0;
  (this->weight_xc_data).allocator = (Allocator *)0x0;
  (this->weight_xc_data).dims = 0;
  (this->weight_xc_data).w = 0;
  (this->weight_xc_data).w = 0;
  (this->weight_xc_data).h = 0;
  (this->weight_xc_data).d = 0;
  (this->weight_xc_data).c = 0;
  (this->weight_xc_data).cstep = 0;
  (this->bias_c_data).data = (void *)0x0;
  (this->bias_c_data).elempack = 0;
  (this->bias_c_data).refcount = (int *)0x0;
  (this->bias_c_data).elemsize = 0;
  (this->bias_c_data).allocator = (Allocator *)0x0;
  (this->bias_c_data).dims = 0;
  (this->bias_c_data).w = 0;
  (this->bias_c_data).w = 0;
  (this->bias_c_data).h = 0;
  (this->bias_c_data).d = 0;
  (this->bias_c_data).c = 0;
  (this->bias_c_data).cstep = 0;
  (this->weight_hr_data).data = (void *)0x0;
  (this->weight_hr_data).refcount = (int *)0x0;
  (this->weight_hr_data).elemsize = 0;
  (this->weight_hr_data).elempack = 0;
  (this->weight_hr_data).w = 0;
  (this->weight_hr_data).h = 0;
  (this->weight_hr_data).d = 0;
  (this->weight_hr_data).c = 0;
  (this->weight_hr_data).allocator = (Allocator *)0x0;
  (this->weight_hr_data).dims = 0;
  (this->weight_hr_data).w = 0;
  (this->weight_hc_data_int8_scales).refcount = (int *)0x0;
  (this->weight_hc_data_int8_scales).elemsize = 0;
  (this->weight_hr_data).cstep = 0;
  (this->weight_hc_data_int8_scales).data = (void *)0x0;
  (this->weight_hc_data_int8_scales).elempack = 0;
  (this->weight_hc_data_int8_scales).w = 0;
  (this->weight_hc_data_int8_scales).h = 0;
  (this->weight_hc_data_int8_scales).d = 0;
  (this->weight_hc_data_int8_scales).c = 0;
  (this->weight_hc_data_int8_scales).allocator = (Allocator *)0x0;
  (this->weight_hc_data_int8_scales).dims = 0;
  (this->weight_hc_data_int8_scales).w = 0;
  (this->weight_xc_data_int8_scales).elempack = 0;
  (this->weight_xc_data_int8_scales).refcount = (int *)0x0;
  (this->weight_xc_data_int8_scales).elemsize = 0;
  (this->weight_hc_data_int8_scales).cstep = 0;
  (this->weight_xc_data_int8_scales).data = (void *)0x0;
  (this->weight_xc_data_int8_scales).w = 0;
  (this->weight_xc_data_int8_scales).h = 0;
  (this->weight_xc_data_int8_scales).d = 0;
  (this->weight_xc_data_int8_scales).c = 0;
  (this->weight_xc_data_int8_scales).allocator = (Allocator *)0x0;
  (this->weight_xc_data_int8_scales).dims = 0;
  (this->weight_xc_data_int8_scales).w = 0;
  return;
}

Assistant:

LSTM::LSTM()
{
    one_blob_only = false;
    support_inplace = false;
}